

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O2

void __thiscall
cali::AttributeExtract::AttributeExtractImpl::process_node
          (AttributeExtractImpl *this,CaliperMetadataAccessInterface *db,Node *node)

{
  Node *pNVar1;
  initializer_list<cali::Entry> __l;
  allocator_type local_61;
  EntryList rec;
  Entry local_40;
  
  if (*(long *)(node + 0x30) == 8) {
    local_40.m_node = (this->m_id_attr).m_node;
    if (local_40.m_node == (Node *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rec,"attribute.id",(allocator<char> *)&local_40);
      pNVar1 = (Node *)(**(code **)(*(long *)db + 0x20))(db,&rec,3,1,0,0,0);
      (this->m_id_attr).m_node = pNVar1;
      std::__cxx11::string::~string((string *)&rec);
      local_40.m_node = (this->m_id_attr).m_node;
    }
    local_40.m_value.m_v.value = *(anon_union_8_7_33918203_for_value *)(node + 0x10);
    local_40.m_value.m_v.type_and_size = 3;
    __l._M_len = 1;
    __l._M_array = &local_40;
    std::vector<cali::Entry,_std::allocator<cali::Entry>_>::vector(&rec,__l,&local_61);
    for (; (node != (Node *)0x0 && (*(long *)(node + 0x10) != -1));
        node = *(Node **)(*(long *)node + *(long *)(node + 8))) {
      local_40.m_node = (Node *)(**(code **)(*(long *)db + 8))(db,*(long *)(node + 0x30));
      local_40.m_value.m_v.type_and_size = *(uint64_t *)(node + 0x38);
      local_40.m_value.m_v.value = *(anon_union_8_7_33918203_for_value *)(node + 0x40);
      std::vector<cali::Entry,_std::allocator<cali::Entry>_>::emplace_back<cali::Entry>
                (&rec,&local_40);
    }
    std::
    function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
    ::operator()(&this->m_snap_fn,db,&rec);
    std::_Vector_base<cali::Entry,_std::allocator<cali::Entry>_>::~_Vector_base
              (&rec.super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>);
  }
  return;
}

Assistant:

void process_node(CaliperMetadataAccessInterface& db, const Node* node)
    {
        if (node->attribute() != s_attr_id)
            return;

        if (!m_id_attr)
            m_id_attr = db.create_attribute("attribute.id", CALI_TYPE_UINT, CALI_ATTR_ASVALUE);

        EntryList rec { Entry(m_id_attr, node->id()) };

        for (; node && node->id() != CALI_INV_ID; node = node->parent())
            rec.push_back(Entry(db.get_attribute(node->attribute()), node->data()));

        m_snap_fn(db, rec);
    }